

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.hh
# Opt level: O2

int4 __thiscall TypeArray::compare(TypeArray *this,Datatype *op,int4 level)

{
  type_metatype tVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = op->size - (this->super_Datatype).size;
  if (uVar3 == 0) {
    tVar1 = (this->super_Datatype).metatype;
    if (tVar1 != op->metatype) {
      return (uint)((int)op->metatype <= (int)tVar1) * 2 + -1;
    }
    if (0 < level) {
      iVar4 = (*this->arrayof->_vptr_Datatype[8])
                        (this->arrayof,op[1]._vptr_Datatype,(ulong)(level - 1));
      return iVar4;
    }
    uVar2 = (this->super_Datatype).id;
    uVar3 = 0;
    if (uVar2 != op->id) {
      uVar3 = -(uint)(uVar2 < op->id) | 1;
    }
  }
  return uVar3;
}

Assistant:

const string &getName(void) const { return name; }